

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef BinaryenRefNull(BinaryenModuleRef module,BinaryenType type)

{
  bool bVar1;
  HeapType type_00;
  BinaryenExpressionRef pEVar2;
  Builder local_28;
  Type local_20;
  Type type_;
  BinaryenType type_local;
  BinaryenModuleRef module_local;
  
  type_.id = type;
  wasm::Type::Type(&local_20,type);
  bVar1 = wasm::Type::isNullable(&local_20);
  if (!bVar1) {
    __assert_fail("type_.isNullable()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x637,"BinaryenExpressionRef BinaryenRefNull(BinaryenModuleRef, BinaryenType)");
  }
  wasm::Builder::Builder(&local_28,module);
  type_00 = wasm::Type::getHeapType(&local_20);
  pEVar2 = (BinaryenExpressionRef)wasm::Builder::makeRefNull(&local_28,type_00);
  return pEVar2;
}

Assistant:

BinaryenExpressionRef BinaryenRefNull(BinaryenModuleRef module,
                                      BinaryenType type) {
  Type type_(type);
  assert(type_.isNullable());
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeRefNull(type_.getHeapType()));
}